

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# HashMap.h
# Opt level: O2

Node * __thiscall HashMap<TypeClass_*>::first(HashMap<TypeClass_*> *this,uint hash)

{
  Node *pNVar1;
  Node **ppNVar2;
  
  ppNVar2 = (Node **)((ulong)((hash & 0x3ff) << 3) + (long)this->entries);
  while( true ) {
    pNVar1 = *ppNVar2;
    if ((pNVar1 == (Node *)0x0) || (pNVar1->hash == hash)) break;
    ppNVar2 = &pNVar1->next;
  }
  return pNVar1;
}

Assistant:

Node* first(unsigned int hash)
	{
		unsigned int bucket = hash & bucketMask;
		Node *curr = entries[bucket];
		while(curr)
		{
			if(curr->hash == hash)
				return curr;
			curr = curr->next;
		}
		return NULL;
	}